

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error externalEntityInitProcessor3(XML_Parser parser,char *start,char *end,char **endPtr)

{
  XML_Error XVar1;
  char *pcStack_40;
  XML_Error result;
  char *next;
  char **ppcStack_30;
  int tok;
  char **endPtr_local;
  char *end_local;
  char *start_local;
  XML_Parser parser_local;
  
  parser->m_eventPtr = start;
  pcStack_40 = start;
  ppcStack_30 = endPtr;
  endPtr_local = (char **)end;
  end_local = start;
  start_local = (char *)parser;
  next._4_4_ = (*parser->m_encoding->scanners[1])
                         (parser->m_encoding,start,end,&stack0xffffffffffffffc0);
  *(char **)(start_local + 0x210) = pcStack_40;
  if (next._4_4_ == -2) {
    if (start_local[0x374] == '\0') {
      *ppcStack_30 = end_local;
      parser_local._4_4_ = XML_ERROR_NONE;
    }
    else {
      parser_local._4_4_ = XML_ERROR_PARTIAL_CHAR;
    }
  }
  else if (next._4_4_ == -1) {
    if (start_local[0x374] == '\0') {
      *ppcStack_30 = end_local;
      parser_local._4_4_ = XML_ERROR_NONE;
    }
    else {
      parser_local._4_4_ = XML_ERROR_UNCLOSED_TOKEN;
    }
  }
  else {
    if (next._4_4_ == 0xc) {
      XVar1 = processXmlDecl((XML_Parser)start_local,1,end_local,pcStack_40);
      if (XVar1 != XML_ERROR_NONE) {
        return XVar1;
      }
      if (*(int *)(start_local + 0x370) == 2) {
        return XML_ERROR_ABORTED;
      }
      if (*(int *)(start_local + 0x370) == 3) {
        *ppcStack_30 = pcStack_40;
        return XML_ERROR_NONE;
      }
      end_local = pcStack_40;
    }
    *(code **)(start_local + 0x1f8) = externalEntityContentProcessor;
    start_local[0x234] = '\x01';
    start_local[0x235] = '\0';
    start_local[0x236] = '\0';
    start_local[0x237] = '\0';
    parser_local._4_4_ =
         externalEntityContentProcessor
                   ((XML_Parser)start_local,end_local,(char *)endPtr_local,ppcStack_30);
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error PTRCALL
externalEntityInitProcessor3(XML_Parser parser,
                             const char *start,
                             const char *end,
                             const char **endPtr)
{
  int tok;
  const char *next = start; /* XmlContentTok doesn't always set the last arg */
  parser->m_eventPtr = start;
  tok = XmlContentTok(parser->m_encoding, start, end, &next);
  parser->m_eventEndPtr = next;

  switch (tok) {
  case XML_TOK_XML_DECL:
    {
      enum XML_Error result;
      result = processXmlDecl(parser, 1, start, next);
      if (result != XML_ERROR_NONE)
        return result;
      switch (parser->m_parsingStatus.parsing) {
      case XML_SUSPENDED:
        *endPtr = next;
        return XML_ERROR_NONE;
      case XML_FINISHED:
        return XML_ERROR_ABORTED;
      default:
        start = next;
      }
    }
    break;
  case XML_TOK_PARTIAL:
    if (!parser->m_parsingStatus.finalBuffer) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    return XML_ERROR_UNCLOSED_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (!parser->m_parsingStatus.finalBuffer) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    return XML_ERROR_PARTIAL_CHAR;
  }
  parser->m_processor = externalEntityContentProcessor;
  parser->m_tagLevel = 1;
  return externalEntityContentProcessor(parser, start, end, endPtr);
}